

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O2

bool __thiscall nvtt::OutputOptions::Private::openFile(Private *this)

{
  bool bVar1;
  int iVar2;
  DefaultOutputHandler *this_00;
  bool bVar3;
  
  bVar3 = true;
  if ((this->fileName).super_StringBuilder.m_size != 0) {
    if (this->outputHandler != (OutputHandler *)0x0) {
      iVar2 = nvAbort("outputHandler == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/OutputOptions.cpp"
                      ,0x50,"bool nvtt::OutputOptions::Private::openFile() const");
      if (iVar2 == 1) {
        raise(5);
      }
    }
    this_00 = (DefaultOutputHandler *)operator_new(0x28);
    DefaultOutputHandler::DefaultOutputHandler(this_00,(this->fileName).super_StringBuilder.m_str);
    bVar1 = nv::StdStream::isError(&(this_00->stream).super_StdStream);
    if (bVar1) {
      bVar3 = false;
    }
    else {
      this->outputHandler = (OutputHandler *)this_00;
    }
  }
  return bVar3;
}

Assistant:

bool OutputOptions::Private::openFile() const
{
	if (!fileName.isNull())
	{
		nvCheck(outputHandler == NULL);
		
		DefaultOutputHandler * oh = new DefaultOutputHandler(fileName.str());
		if (oh->stream.isError())
		{
			return false;
		}
		
		outputHandler = oh;
	}
	
	return true;
}